

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

Result file_write(char *filename,FileData *file_data)

{
  FILE *__s;
  size_t sVar1;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    file_write_cold_2();
  }
  else {
    sVar1 = fwrite(file_data->data,file_data->size,1,__s);
    if (sVar1 == 1) {
      fclose(__s);
      return OK;
    }
    file_write_cold_1();
  }
  return ERROR;
}

Assistant:

Result file_write(const char* filename, const FileData* file_data) {
  FILE* f = fopen(filename, "wb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  CHECK_MSG(fwrite(file_data->data, file_data->size, 1, f) == 1,
            "fwrite failed.\n");
  fclose(f);
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}